

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O0

void printerror(int status)

{
  int iVar1;
  uint in_EDI;
  char errmsg [81];
  char status_str [31];
  undefined1 auStack_88 [16];
  char *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  undefined1 local_28 [36];
  uint local_4;
  
  local_4 = in_EDI;
  if (in_EDI != 0) {
    fprintf(_stderr,"\n*** Error occurred during program execution ***\n");
  }
  ffgerr(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
  fprintf(_stderr,"\nstatus = %d: %s\n",(ulong)local_4,local_28);
  iVar1 = ffgmsg((char *)0x106e1d);
  if (iVar1 != 0) {
    fprintf(_stderr,"\nError message stack:\n");
    fprintf(_stderr," %s\n",auStack_88);
    while (iVar1 = ffgmsg((char *)0x106e5d), iVar1 != 0) {
      fprintf(_stderr," %s\n",auStack_88);
    }
  }
  exit(local_4);
}

Assistant:

void printerror( int status)
{
    /*****************************************************/
    /* Print out cfitsio error messages and exit program */
    /*****************************************************/

    char status_str[FLEN_STATUS], errmsg[FLEN_ERRMSG];
  
    if (status)
      fprintf(stderr, "\n*** Error occurred during program execution ***\n");

    fits_get_errstatus(status, status_str);   /* get the error description */
    fprintf(stderr, "\nstatus = %d: %s\n", status, status_str);

    /* get first message; null if stack is empty */
    if ( fits_read_errmsg(errmsg) ) 
    {
         fprintf(stderr, "\nError message stack:\n");
         fprintf(stderr, " %s\n", errmsg);

         while ( fits_read_errmsg(errmsg) )  /* get remaining messages */
             fprintf(stderr, " %s\n", errmsg);
    }

    exit( status );       /* terminate the program, returning error status */
}